

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O2

int CVodeSetMinStep(void *cvode_mem,sunrealtype hmin)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x131;
  }
  else {
    if (0.0 <= hmin) {
      if ((hmin != 0.0) || (NAN(hmin))) {
        if (1.0 < *(double *)((long)cvode_mem + 0x2f0) * hmin) {
          msgfmt = "Inconsistent step size limits: hmin > hmax.";
          error_code = -0x16;
          line = 0x147;
          goto LAB_001120c5;
        }
        *(sunrealtype *)((long)cvode_mem + 0x2e8) = hmin;
      }
      else {
        *(undefined8 *)((long)cvode_mem + 0x2e8) = 0;
      }
      return 0;
    }
    msgfmt = "hmin < 0 illegal.";
    error_code = -0x16;
    line = 0x139;
  }
LAB_001120c5:
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeSetMinStep",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_io.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVodeSetMinStep(void* cvode_mem, sunrealtype hmin)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (hmin < ZERO)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NEG_HMIN);
    return (CV_ILL_INPUT);
  }

  /* Passing 0 sets hmin = zero */
  if (hmin == ZERO)
  {
    cv_mem->cv_hmin = HMIN_DEFAULT;
    return (CV_SUCCESS);
  }

  if (hmin * cv_mem->cv_hmax_inv > ONE)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_HMIN_HMAX);
    return (CV_ILL_INPUT);
  }

  cv_mem->cv_hmin = hmin;

  return (CV_SUCCESS);
}